

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

KeyFrameListList * __thiscall
Assimp::FBX::FBXConverter::GetKeyframeList
          (KeyFrameListList *__return_storage_ptr__,FBXConverter *this,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *nodes,int64_t start,int64_t stop)

{
  _Base_ptr p_Var1;
  long lVar2;
  long lVar3;
  iterator __position;
  iterator __position_00;
  int iVar4;
  AnimationCurveMap *pAVar5;
  long lVar6;
  vector<float,std::allocator<float>> *this_00;
  float *__args;
  _Base_ptr p_Var7;
  undefined4 uVar8;
  size_type __n;
  _Base_ptr p_Var9;
  ulong uVar10;
  pointer ppAVar11;
  shared_ptr<std::vector<float,_std::allocator<float>_>_> Values;
  shared_ptr<std::vector<long,_std::allocator<long>_>_> Keys;
  int64_t k;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  vector<long,std::allocator<long>> *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  undefined4 local_7c;
  tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
  local_78;
  pointer local_50;
  _Base_ptr local_48;
  pointer local_40;
  _Base_ptr local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  ::reserve(__return_storage_ptr__,
            ((long)(nodes->
                   super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(nodes->
                   super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * 3);
  ppAVar11 = (nodes->
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (nodes->
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar11 != local_50) {
    do {
      if (*ppAVar11 == (AnimationCurveNode *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                      ,0xc92,
                      "FBXConverter::KeyFrameListList Assimp::FBX::FBXConverter::GetKeyframeList(const std::vector<const AnimationCurveNode *> &, int64_t, int64_t)"
                     );
      }
      pAVar5 = AnimationCurveNode::Curves_abi_cxx11_(*ppAVar11);
      p_Var7 = (pAVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var9 = &(pAVar5->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_48 = p_Var9;
      local_40 = ppAVar11;
      if (p_Var7 != p_Var9) {
        do {
          p_Var1 = p_Var7 + 1;
          iVar4 = std::__cxx11::string::compare((char *)p_Var1);
          if (iVar4 == 0) {
            uVar8 = 0;
LAB_0055deb3:
            lVar2 = *(long *)(p_Var7 + 2);
            lVar6 = *(long *)(lVar2 + 0x40) - *(long *)(lVar2 + 0x38);
            local_38 = p_Var7;
            if ((lVar6 == 0) ||
               (lVar6 >> 3 != *(long *)(lVar2 + 0x58) - *(long *)(lVar2 + 0x50) >> 2)) {
LAB_0055e134:
              __assert_fail("curve->GetKeys().size() == curve->GetValues().size() && curve->GetKeys().size()"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                            ,0xca7,
                            "FBXConverter::KeyFrameListList Assimp::FBX::FBXConverter::GetKeyframeList(const std::vector<const AnimationCurveNode *> &, int64_t, int64_t)"
                           );
            }
            local_90 = (vector<long,std::allocator<long>> *)operator_new(0x18);
            *(undefined8 *)local_90 = 0;
            *(pointer *)(local_90 + 8) = (pointer)0x0;
            *(pointer *)(local_90 + 0x10) = (pointer)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::vector<long,std::allocator<long>>*>
                      (&local_88,(vector<long,_std::allocator<long>_> *)local_90);
            this_00 = (vector<float,std::allocator<float>> *)operator_new(0x18);
            *(undefined8 *)this_00 = 0;
            *(undefined8 *)(this_00 + 8) = 0;
            *(undefined8 *)(this_00 + 0x10) = 0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::vector<float,std::allocator<float>>*>
                      (&local_98,(vector<float,_std::allocator<float>_> *)this_00);
            lVar6 = *(long *)(lVar2 + 0x38);
            lVar3 = *(long *)(lVar2 + 0x40);
            __n = lVar3 - lVar6 >> 3;
            local_7c = uVar8;
            std::vector<long,_std::allocator<long>_>::reserve
                      ((vector<long,_std::allocator<long>_> *)local_90,__n);
            std::vector<float,_std::allocator<float>_>::reserve
                      ((vector<float,_std::allocator<float>_> *)this_00,__n);
            if (lVar3 != lVar6) {
              lVar6 = 0;
              uVar10 = 0;
              do {
                if ((ulong)(*(long *)(lVar2 + 0x40) - *(long *)(lVar2 + 0x38) >> 3) <= uVar10) {
LAB_0055e123:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar10);
                  goto LAB_0055e134;
                }
                local_78.
                super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                .
                super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                ._0_8_ = *(long *)(*(long *)(lVar2 + 0x38) + uVar10 * 8);
                if ((long)local_78.
                          super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          .
                          super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          ._0_8_ <= stop + 10000 &&
                    start + -10000 <=
                    (long)local_78.
                          super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          .
                          super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          ._0_8_) {
                  __position._M_current = *(long **)(local_90 + 8);
                  if (__position._M_current == *(long **)(local_90 + 0x10)) {
                    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                              (local_90,__position,(long *)&local_78);
                  }
                  else {
                    *__position._M_current =
                         local_78.
                         super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                         .
                         super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                         ._0_8_;
                    *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
                  }
                  if ((ulong)(*(long *)(lVar2 + 0x58) - *(long *)(lVar2 + 0x50) >> 2) <= uVar10)
                  goto LAB_0055e123;
                  __args = (float *)(*(long *)(lVar2 + 0x50) + lVar6);
                  __position_00._M_current = *(float **)(this_00 + 8);
                  if (__position_00._M_current == *(float **)(this_00 + 0x10)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              (this_00,__position_00,__args);
                  }
                  else {
                    *__position_00._M_current = *__args;
                    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
                  }
                }
                uVar10 = uVar10 + 1;
                lVar6 = lVar6 + 4;
              } while (__n + (__n == 0) != uVar10);
            }
            p_Var7 = local_38;
            ppAVar11 = local_40;
            p_Var9 = local_48;
            local_78.
            super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
            .
            super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
            .super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
            _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_7c;
            local_78.
            super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
            .
            super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
            .
            super__Head_base<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_false>
            ._M_head_impl.
            super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = local_98._M_pi;
            if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
              }
            }
            local_78.
            super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
            .
            super__Head_base<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_false>
            ._M_head_impl.
            super___shared_ptr<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_90;
            local_78.
            super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
            .
            super__Head_base<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_false>
            ._M_head_impl.
            super___shared_ptr<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = local_88._M_pi;
            if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
              }
            }
            local_78.
            super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
            .
            super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
            .
            super__Head_base<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_false>
            ._M_head_impl.
            super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)this_00;
            std::
            vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
            ::
            emplace_back<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>
                      ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                        *)__return_storage_ptr__,&local_78);
            if (local_78.
                super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                .
                super__Head_base<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_false>
                ._M_head_impl.
                super___shared_ptr<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_78.
                         super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                         .
                         super__Head_base<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_false>
                         ._M_head_impl.
                         super___shared_ptr<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_78.
                super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                .
                super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                .
                super__Head_base<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_false>
                ._M_head_impl.
                super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_78.
                         super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                         .
                         super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                         .
                         super__Head_base<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_false>
                         ._M_head_impl.
                         super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
            }
            if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
            }
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)p_Var1);
            if (iVar4 == 0) {
              uVar8 = 1;
              goto LAB_0055deb3;
            }
            iVar4 = std::__cxx11::string::compare((char *)p_Var1);
            if (iVar4 == 0) {
              uVar8 = 2;
              goto LAB_0055deb3;
            }
            LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x55de9e);
          }
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != p_Var9);
      }
      ppAVar11 = ppAVar11 + 1;
    } while (ppAVar11 != local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

FBXConverter::KeyFrameListList FBXConverter::GetKeyframeList(const std::vector<const AnimationCurveNode*>& nodes, int64_t start, int64_t stop)
        {
            KeyFrameListList inputs;
            inputs.reserve(nodes.size() * 3);

            //give some breathing room for rounding errors
            int64_t adj_start = start - 10000;
            int64_t adj_stop = stop + 10000;

            for (const AnimationCurveNode* node : nodes) {
                ai_assert(node);

                const AnimationCurveMap& curves = node->Curves();
                for (const AnimationCurveMap::value_type& kv : curves) {

                    unsigned int mapto;
                    if (kv.first == "d|X") {
                        mapto = 0;
                    }
                    else if (kv.first == "d|Y") {
                        mapto = 1;
                    }
                    else if (kv.first == "d|Z") {
                        mapto = 2;
                    }
                    else {
                        FBXImporter::LogWarn("ignoring scale animation curve, did not recognize target component");
                        continue;
                    }

                    const AnimationCurve* const curve = kv.second;
                    ai_assert(curve->GetKeys().size() == curve->GetValues().size() && curve->GetKeys().size());

                    //get values within the start/stop time window
                    std::shared_ptr<KeyTimeList> Keys(new KeyTimeList());
                    std::shared_ptr<KeyValueList> Values(new KeyValueList());
                    const size_t count = curve->GetKeys().size();
                    Keys->reserve(count);
                    Values->reserve(count);
                    for (size_t n = 0; n < count; n++)
                    {
                        int64_t k = curve->GetKeys().at(n);
                        if (k >= adj_start && k <= adj_stop)
                        {
                            Keys->push_back(k);
                            Values->push_back(curve->GetValues().at(n));
                        }
                    }

                    inputs.push_back(std::make_tuple(Keys, Values, mapto));
                }
            }
            return inputs; // pray for NRVO :-)
        }